

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O1

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG>::ProcessFullySpecifiedNode
          (BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG> *this,
          BGIP_BnB_NodePtr *node)

{
  int *piVar1;
  double dVar2;
  sp_counted_base *psVar3;
  char cVar4;
  ostream *poVar5;
  E *this_00;
  shared_count *this_01;
  double value;
  BGIP_BnB_NodePtr local_68;
  BGIP_BnB_NodePtr local_58;
  BGIP_BnB_NodePtr local_48;
  BGIP_BnB_NodePtr local_38;
  BGIP_BnB_NodePtr local_28;
  
  cVar4 = BGIP_BnB_Node::IsFullySpecifiedPolicy((uint)node->px);
  if (cVar4 != '\0') {
    psVar3 = (node->pn).pi_;
    local_28.px = node->px;
    local_28.pn.pi_ = (node->pn).pi_;
    if (psVar3 != (sp_counted_base *)0x0) {
      LOCK();
      piVar1 = &psVar3->use_count_;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    value = ComputeValueOfFullySpecifiedPolicy(this,&local_28);
    boost::detail::shared_count::~shared_count(&local_28.pn);
    if (3 < this->_m_verbosity) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "BGIP_SolverBranchAndBound Found fully specified policy with value ",0x42);
      poVar5 = std::ostream::_M_insert<double>(value);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    psVar3 = (node->pn).pi_;
    local_38.px = node->px;
    local_38.pn.pi_ = (node->pn).pi_;
    if (psVar3 != (sp_counted_base *)0x0) {
      LOCK();
      piVar1 = &psVar3->use_count_;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    ConvertNodeToPolicyAndAddToSolution(this,&local_38,value);
    boost::detail::shared_count::~shared_count(&local_38.pn);
    dVar2 = this->_m_maxLowerBound;
    if ((dVar2 < value) && (this->_m_maxLowerBound = value, 0 < this->_m_verbosity)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"BGIP_SolverBranchAndBound Updated max lower bound to ",0x35)
      ;
      poVar5 = std::ostream::_M_insert<double>(this->_m_maxLowerBound);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    if (*(ulong *)&(this->
                   super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>).
                   super_BGIP_IncrementalSolverInterface.field_0x30 < 2) {
      if (value <= dVar2) {
        psVar3 = (node->pn).pi_;
        local_68.px = node->px;
        local_68.pn.pi_ = (node->pn).pi_;
        if (psVar3 != (sp_counted_base *)0x0) {
          LOCK();
          piVar1 = &psVar3->use_count_;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        this_01 = &local_68.pn;
        PopAndDeleteNode(this,&local_68);
      }
      else {
        boost::shared_ptr<BGIP_BnB_Node>::operator=(&this->_m_bestNode,node);
        psVar3 = (node->pn).pi_;
        local_58.px = node->px;
        local_58.pn.pi_ = (node->pn).pi_;
        if (psVar3 != (sp_counted_base *)0x0) {
          LOCK();
          piVar1 = &psVar3->use_count_;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        this_01 = &local_58.pn;
        Pop(this,&local_58);
      }
    }
    else {
      psVar3 = (node->pn).pi_;
      local_48.px = node->px;
      local_48.pn.pi_ = (node->pn).pi_;
      if (psVar3 != (sp_counted_base *)0x0) {
        LOCK();
        piVar1 = &psVar3->use_count_;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      this_01 = &local_48.pn;
      Pop(this,&local_48);
    }
    boost::detail::shared_count::~shared_count(this_01);
    return;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"ProcessFullySpecifiedNode called with a node which is not fully specified");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void ProcessFullySpecifiedNode(BGIP_BnB_NodePtr node)
    {
        if(!node->IsFullySpecifiedPolicy(_m_maxDepth))
            throw(E("ProcessFullySpecifiedNode called with a node which is not fully specified"));

        // compute the true value of this jpol
        double value=ComputeValueOfFullySpecifiedPolicy(node);
        if(_m_verbosity>3)
            std::cout << "BGIP_SolverBranchAndBound Found fully specified policy with value "
                      << value << ":" << std::endl;
        
        ConvertNodeToPolicyAndAddToSolution(node,value);

        bool lowerBoundImproved=false;
        // update max lowerbound if possible
        if(value > _m_maxLowerBound)
        {
            _m_maxLowerBound=value;
            lowerBoundImproved=true;
            if(_m_verbosity>=1)
                std::cout << "BGIP_SolverBranchAndBound Updated max lower bound to "
                          << _m_maxLowerBound << std::endl; 
        }

        if(this->GetNrDesiredSolutions()>1)
        {
            // if we want more than 1 solution, keep track of it in the
            // closed queue.
    //         if(lowerBoundImproved)
    //         {
    //         }
    //         else
    //         {
                Pop(node);
    //            _m_closedQueueFullySpecifiedNodes->push(node);
    //        }

        }
        else 
        {
            if(lowerBoundImproved)
            {
                //save the new best node
                _m_bestNode = node;
                //and remove it from the top of the priority queue
                Pop(node); 
            
                //", now pruning..." << std::endl;
                // now we could prune the queue, but that's slow
                // because of the need to reconstruct a new
                // priority queue, so instead we rely on
                // on-the-fly pruning
#if 0 // slow
                Prune(_m_maxLowerBound);
#endif
            }
            else // we only 
            {
                //remove the node from the prior.Q and delete it
                PopAndDeleteNode(node);
            }
        }
    }